

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvector.h
# Opt level: O3

bool __thiscall
dg::ADT::
SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
::get(SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      *this,unsigned_long i)

{
  const_iterator cVar1;
  bool bVar2;
  unsigned_long sft;
  ulong local_10;
  
  local_10 = i & 0xffffffffffffffc0;
  cVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_10);
  if (cVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
      == (__node_type *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = (*(ulong *)((long)cVar1.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              ._M_cur + 0x10) >> ((ulong)(uint)((int)i - (int)local_10) & 0x3f) & 1)
            != 0;
  }
  return bVar2;
}

Assistant:

bool get(IndexT i) const {
        auto sft = _shift(i);
        assert(sft % BITS_IN_BUCKET == 0);

        auto it = _bits.find(sft);
        if (it == _bits.end()) {
            return false;
        }

        return (it->second & (BitsT{1} << (i - sft)));
    }